

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O2

int __thiscall Abstract<4U>::rename(Abstract<4U> *this,char *__old,char *__new)

{
  int iVar1;
  char *__s;
  
  __s = (char *)operator_new__(0x14);
  sprintf(__s,"WavingSketch<%d,%d>",(ulong)__old & 0xffffffff,(ulong)__new & 0xffffffff);
  iVar1 = std::__cxx11::string::assign((char *)&this->name);
  return iVar1;
}

Assistant:

void rename(int slot_num, int counter_num) {
		char* tp = new char[20];
		std::sprintf(tp, "WavingSketch<%d,%d>", slot_num, counter_num);
		name = tp;
	}